

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QTime __thiscall QLocale::toTime(QLocale *this,QString *string,QString *format)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RDX;
  QDateTimeParser *in_RSI;
  QCalendar in_RDI;
  long in_FS_OFFSET;
  QDateTimeParser dt;
  QTime time;
  QStringView in_stack_00000280;
  QLocale *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar3;
  QString *str;
  QStringView *this_00;
  int baseYear;
  QDate *in_stack_ffffffffffffff40;
  QString *in_stack_ffffffffffffff48;
  QDateTimeParser *in_stack_ffffffffffffff50;
  undefined4 in_stack_fffffffffffffff0;
  QTime QVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.mds = -0x55555556;
  QTime::QTime((QTime *)&stack0xfffffffffffffff4);
  str = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  QCalendar::QCalendar((QCalendar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QDateTimeParser::QDateTimeParser(in_RSI,(Type)((ulong)in_RDX >> 0x20),(Context)in_RDX,in_RDI);
  baseYear = (int)((ulong)in_RSI >> 0x20);
  QDateTimeParser::setDefaultLocale
            ((QDateTimeParser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  QStringView::QStringView<QString,_true>(this_00,str);
  bVar2 = QDateTimeParser::parseFormat
                    ((QDateTimeParser *)CONCAT44(QVar4.mds,in_stack_fffffffffffffff0),
                     in_stack_00000280);
  uVar3 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffef4);
  if (bVar2) {
    QDateTimeParser::fromString
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (QTime *)in_RDI.d_ptr,baseYear);
  }
  QDateTimeParser::~QDateTimeParser((QDateTimeParser *)CONCAT44(uVar3,in_stack_fffffffffffffef0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QTime)QVar4.mds;
}

Assistant:

QTime QLocale::toTime(const QString &string, const QString &format) const
{
    QTime time;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QTime, QDateTimeParser::FromString, QCalendar());
    dt.setDefaultLocale(*this);
    if (dt.parseFormat(format))
        dt.fromString(string, nullptr, &time);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
#endif
    return time;
}